

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_image.cc
# Opt level: O1

void __thiscall InputImage::InputImage(InputImage *this,char *filename)

{
  istream *this_00;
  Complex *pCVar1;
  ostream *poVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  float real;
  ifstream ifs;
  float local_24c;
  Complex local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,filename,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    this_00 = (istream *)std::istream::operator>>((istream *)local_238,&this->w);
    std::istream::operator>>(this_00,&this->h);
    lVar5 = (long)this->h * (long)this->w;
    uVar4 = lVar5 * 8;
    iVar3 = (int)lVar5;
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar6 = uVar4;
    }
    pCVar1 = (Complex *)operator_new__(uVar6);
    if (iVar3 != 0) {
      uVar6 = 0;
      do {
        Complex::Complex((Complex *)((long)&pCVar1->real + uVar6));
        uVar6 = uVar6 + 8;
      } while (uVar4 != uVar6);
    }
    this->data = pCVar1;
    if (0 < this->h) {
      iVar3 = 0;
      do {
        if (0 < this->w) {
          lVar5 = 0;
          do {
            std::istream::_M_extract<float>((float *)local_238);
            Complex::Complex(&local_240,local_24c);
            this->data[(long)this->w * (long)iVar3 + lVar5] = local_240;
            lVar5 = lVar5 + 1;
          } while ((int)lVar5 < this->w);
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < this->h);
    }
    std::ifstream::~ifstream(local_238);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Can\'t open image file ",0x16);
  poVar2 = std::operator<<((ostream *)&std::cout,filename);
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

InputImage::InputImage(const char* filename) {
    std::ifstream ifs(filename);
    if(!ifs) {
        std::cout << "Can't open image file " << filename << std::endl;
        exit(1);
    }

    ifs >> w >> h;
    data = new Complex[w * h];
    for(int r = 0; r < h; ++r) {
        for(int c = 0; c < w; ++c) {
            float real;
            ifs >> real;
            data[r * w + c] = Complex(real);
        }
    }
}